

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# private_still_impl.h
# Opt level: O2

void __thiscall raspicam::_private::Private_Impl_Still::Private_Impl_Still(Private_Impl_Still *this)

{
  this->API_NAME = "Private_Impl_Still";
  raspicam::_private::Private_Impl_Still::setDefaults();
  this->_isInitialized = false;
  this->camera = (MMAL_COMPONENT_T *)0x0;
  this->encoder = (MMAL_COMPONENT_T *)0x0;
  this->encoder_connection = (MMAL_CONNECTION_T *)0x0;
  this->encoder_pool = (MMAL_POOL_T *)0x0;
  this->camera_still_port = (MMAL_PORT_T *)0x0;
  this->encoder_input_port = (MMAL_PORT_T *)0x0;
  this->encoder_output_port = (MMAL_PORT_T *)0x0;
  return;
}

Assistant:

Private_Impl_Still() {
                API_NAME = "Private_Impl_Still";
                setDefaults();
                camera = NULL;
                encoder = NULL;
                encoder_connection = NULL;
                encoder_pool = NULL;
                camera_still_port = NULL;
                encoder_input_port = NULL;
                encoder_output_port = NULL;
		_isInitialized=false;
            }